

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_panel.cxx
# Opt level: O1

Fl_Double_Window * make_function_panel(void)

{
  uint *puVar1;
  Fl_Input *pFVar2;
  Fl_Choice *pFVar3;
  Fl_Return_Button *this;
  Fl_Double_Window *pFVar4;
  Fl_Group *pFVar5;
  Fl_Widget *pFVar6;
  Fl_Group *pFVar7;
  Fl_Text_Editor *pFVar8;
  Fl_Text_Buffer *this_00;
  Fl_Window *this_01;
  Fl_Button *this_02;
  
  pFVar4 = (Fl_Double_Window *)operator_new(0xf0);
  Fl_Double_Window::Fl_Double_Window(pFVar4,0x157,0xe8,"Function/Method Properties");
  function_panel = pFVar4;
  pFVar5 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar5,10,10,0x10e,0x14,(char *)0x0);
  pFVar6 = (Fl_Widget *)operator_new(0x98);
  Fl_Choice::Fl_Choice((Fl_Choice *)pFVar6,10,10,0x4b,0x14,(char *)0x0);
  f_public_member_choice = (Fl_Choice *)pFVar6;
  Fl_Widget::tooltip(pFVar6,"Change member access attribute.");
  pFVar3 = f_public_member_choice;
  (f_public_member_choice->super_Fl_Menu_).down_box_ = '\x0e';
  (pFVar3->super_Fl_Menu_).super_Fl_Widget.label_.size = 0xb;
  (pFVar3->super_Fl_Menu_).textsize_ = 0xb;
  (pFVar3->super_Fl_Menu_).super_Fl_Widget.when_ = '\x01';
  Fl_Menu_::menu(&pFVar3->super_Fl_Menu_,menu_f_public_member_choice);
  pFVar6 = (Fl_Widget *)operator_new(0x98);
  Fl_Choice::Fl_Choice((Fl_Choice *)pFVar6,10,10,0x4b,0x14,(char *)0x0);
  f_public_choice = (Fl_Choice *)pFVar6;
  Fl_Widget::tooltip(pFVar6,"Change widget accessibility.");
  pFVar3 = f_public_choice;
  (f_public_choice->super_Fl_Menu_).down_box_ = '\x0e';
  (pFVar3->super_Fl_Menu_).super_Fl_Widget.label_.size = 0xb;
  (pFVar3->super_Fl_Menu_).textsize_ = 0xb;
  (pFVar3->super_Fl_Menu_).super_Fl_Widget.when_ = '\x01';
  Fl_Menu_::menu(&pFVar3->super_Fl_Menu_,menu_f_public_choice);
  pFVar6 = (Fl_Widget *)operator_new(0x80);
  Fl_Light_Button::Fl_Light_Button((Fl_Light_Button *)pFVar6,0x5f,10,0x78,0x14,"C declaration");
  f_c_button = (Fl_Light_Button *)pFVar6;
  Fl_Widget::tooltip(pFVar6,"Declare with a C interface instead of C++.");
  (f_c_button->super_Fl_Button).super_Fl_Widget.label_.size = 0xb;
  pFVar6 = (Fl_Widget *)operator_new(0x78);
  Fl_Box::Fl_Box((Fl_Box *)pFVar6,0xeb,10,0x2d,0x14,(char *)0x0);
  pFVar7 = Fl_Group::current();
  pFVar7->resizable_ = pFVar6;
  Fl_Group::end(pFVar5);
  pFVar6 = (Fl_Widget *)operator_new(200);
  Fl_Input::Fl_Input((Fl_Input *)pFVar6,10,0x32,0x140,0x14,"Name(args): (blank for main())");
  f_name_input = (Fl_Input *)pFVar6;
  Fl_Widget::tooltip(pFVar6,"The name of the function or method.");
  pFVar2 = f_name_input;
  (pFVar2->super_Fl_Input_).super_Fl_Widget.label_.font = 1;
  (pFVar2->super_Fl_Input_).super_Fl_Widget.label_.size = 0xb;
  (pFVar2->super_Fl_Input_).textfont_ = 4;
  (pFVar2->super_Fl_Input_).textsize_ = 0xb;
  (pFVar2->super_Fl_Input_).super_Fl_Widget.label_.align_ = 5;
  (pFVar2->super_Fl_Input_).super_Fl_Widget.when_ = '\0';
  pFVar6 = (Fl_Widget *)operator_new(200);
  Fl_Input::Fl_Input((Fl_Input *)pFVar6,10,0x5a,0x140,0x14,
                     "Return Type: (blank to return outermost widget)");
  f_return_type_input = (Fl_Input *)pFVar6;
  Fl_Widget::tooltip(pFVar6,"The return type of the function or method.");
  pFVar2 = f_return_type_input;
  (pFVar2->super_Fl_Input_).super_Fl_Widget.label_.font = 1;
  (pFVar2->super_Fl_Input_).super_Fl_Widget.label_.size = 0xb;
  (pFVar2->super_Fl_Input_).textfont_ = 4;
  (pFVar2->super_Fl_Input_).textsize_ = 0xb;
  (pFVar2->super_Fl_Input_).super_Fl_Widget.label_.align_ = 5;
  (pFVar2->super_Fl_Input_).super_Fl_Widget.when_ = '\0';
  pFVar8 = (Fl_Text_Editor *)operator_new(0x1c0);
  Fl_Text_Editor::Fl_Text_Editor(pFVar8,10,0x7d,0x140,0x41,"Comment:");
  f_comment_input = pFVar8;
  Fl_Widget::tooltip((Fl_Widget *)pFVar8,"Function comment in Doxygen format");
  pFVar8 = f_comment_input;
  (f_comment_input->super_Fl_Text_Display).super_Fl_Group.super_Fl_Widget.box_ = '\x03';
  (pFVar8->super_Fl_Text_Display).super_Fl_Group.super_Fl_Widget.label_.font = 1;
  (pFVar8->super_Fl_Text_Display).super_Fl_Group.super_Fl_Widget.label_.size = 0xb;
  (pFVar8->super_Fl_Text_Display).textfont_ = 4;
  (pFVar8->super_Fl_Text_Display).textsize_ = 0xb;
  (pFVar8->super_Fl_Text_Display).mColumnScale = 0.0;
  (pFVar8->super_Fl_Text_Display).super_Fl_Group.super_Fl_Widget.label_.align_ = 5;
  pFVar5 = Fl_Group::current();
  pFVar8 = f_comment_input;
  pFVar5->resizable_ = (Fl_Widget *)f_comment_input;
  this_00 = (Fl_Text_Buffer *)operator_new(0x88);
  Fl_Text_Buffer::Fl_Text_Buffer(this_00,0,0x400);
  Fl_Text_Display::buffer(&pFVar8->super_Fl_Text_Display,this_00);
  Fl_Text_Editor::add_key_binding
            (f_comment_input,0xff09,0,use_tab_navigation,&f_comment_input->key_bindings);
  pFVar5 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar5,10,200,0x140,0x14,(char *)0x0);
  pFVar6 = (Fl_Widget *)operator_new(0x80);
  Fl_Return_Button::Fl_Return_Button((Fl_Return_Button *)pFVar6,0xdc,200,0x32,0x14,"OK");
  f_panel_ok = (Fl_Return_Button *)pFVar6;
  Fl_Widget::tooltip(pFVar6,"Apply the changes.");
  this = f_panel_ok;
  (f_panel_ok->super_Fl_Button).super_Fl_Widget.label_.size = 0xb;
  this_01 = Fl_Widget::window((Fl_Widget *)this);
  Fl_Window::hotspot(this_01,(Fl_Widget *)f_panel_ok,0);
  this_02 = (Fl_Button *)operator_new(0x80);
  Fl_Button::Fl_Button(this_02,0x118,200,0x32,0x14,"Cancel");
  f_panel_cancel = this_02;
  Fl_Widget::tooltip((Fl_Widget *)this_02,"Cancel the changes.");
  (f_panel_cancel->super_Fl_Widget).label_.size = 0xb;
  pFVar6 = (Fl_Widget *)operator_new(0x78);
  Fl_Box::Fl_Box((Fl_Box *)pFVar6,10,200,0xcd,0x14,(char *)0x0);
  pFVar7 = Fl_Group::current();
  pFVar7->resizable_ = pFVar6;
  Fl_Group::end(pFVar5);
  pFVar4 = function_panel;
  puVar1 = &(function_panel->super_Fl_Window).super_Fl_Group.super_Fl_Widget.flags_;
  *puVar1 = *puVar1 | 0x4000;
  Fl_Group::end((Fl_Group *)pFVar4);
  return function_panel;
}

Assistant:

Fl_Double_Window* make_function_panel() {
  { function_panel = new Fl_Double_Window(343, 232, "Function/Method Properties");
    { Fl_Group* o = new Fl_Group(10, 10, 270, 20);
      { f_public_member_choice = new Fl_Choice(10, 10, 75, 20);
        f_public_member_choice->tooltip("Change member access attribute.");
        f_public_member_choice->down_box(FL_BORDER_BOX);
        f_public_member_choice->labelsize(11);
        f_public_member_choice->textsize(11);
        f_public_member_choice->when(FL_WHEN_CHANGED);
        f_public_member_choice->menu(menu_f_public_member_choice);
      } // Fl_Choice* f_public_member_choice
      { f_public_choice = new Fl_Choice(10, 10, 75, 20);
        f_public_choice->tooltip("Change widget accessibility.");
        f_public_choice->down_box(FL_BORDER_BOX);
        f_public_choice->labelsize(11);
        f_public_choice->textsize(11);
        f_public_choice->when(FL_WHEN_CHANGED);
        f_public_choice->menu(menu_f_public_choice);
      } // Fl_Choice* f_public_choice
      { f_c_button = new Fl_Light_Button(95, 10, 120, 20, "C declaration");
        f_c_button->tooltip("Declare with a C interface instead of C++.");
        f_c_button->labelsize(11);
      } // Fl_Light_Button* f_c_button
      { Fl_Box* o = new Fl_Box(235, 10, 45, 20);
        Fl_Group::current()->resizable(o);
      } // Fl_Box* o
      o->end();
    } // Fl_Group* o
    { f_name_input = new Fl_Input(10, 50, 320, 20, "Name(args): (blank for main())");
      f_name_input->tooltip("The name of the function or method.");
      f_name_input->labelfont(1);
      f_name_input->labelsize(11);
      f_name_input->textfont(4);
      f_name_input->textsize(11);
      f_name_input->align(Fl_Align(FL_ALIGN_TOP_LEFT));
      f_name_input->when(FL_WHEN_NEVER);
    } // Fl_Input* f_name_input
    { f_return_type_input = new Fl_Input(10, 90, 320, 20, "Return Type: (blank to return outermost widget)");
      f_return_type_input->tooltip("The return type of the function or method.");
      f_return_type_input->labelfont(1);
      f_return_type_input->labelsize(11);
      f_return_type_input->textfont(4);
      f_return_type_input->textsize(11);
      f_return_type_input->align(Fl_Align(FL_ALIGN_TOP_LEFT));
      f_return_type_input->when(FL_WHEN_NEVER);
    } // Fl_Input* f_return_type_input
    { f_comment_input = new Fl_Text_Editor(10, 125, 320, 65, "Comment:");
      f_comment_input->tooltip("Function comment in Doxygen format");
      f_comment_input->box(FL_DOWN_BOX);
      f_comment_input->labelfont(1);
      f_comment_input->labelsize(11);
      f_comment_input->textfont(4);
      f_comment_input->textsize(11);
      f_comment_input->align(Fl_Align(FL_ALIGN_TOP_LEFT));
      Fl_Group::current()->resizable(f_comment_input);
      f_comment_input->buffer(new Fl_Text_Buffer());
      f_comment_input->add_key_binding(FL_Tab, 0, use_tab_navigation);
    } // Fl_Text_Editor* f_comment_input
    { Fl_Group* o = new Fl_Group(10, 200, 320, 20);
      { f_panel_ok = new Fl_Return_Button(220, 200, 50, 20, "OK");
        f_panel_ok->tooltip("Apply the changes.");
        f_panel_ok->labelsize(11);
        f_panel_ok->window()->hotspot(f_panel_ok);
      } // Fl_Return_Button* f_panel_ok
      { f_panel_cancel = new Fl_Button(280, 200, 50, 20, "Cancel");
        f_panel_cancel->tooltip("Cancel the changes.");
        f_panel_cancel->labelsize(11);
      } // Fl_Button* f_panel_cancel
      { Fl_Box* o = new Fl_Box(10, 200, 205, 20);
        Fl_Group::current()->resizable(o);
      } // Fl_Box* o
      o->end();
    } // Fl_Group* o
    function_panel->set_modal();
    function_panel->end();
  } // Fl_Double_Window* function_panel
  return function_panel;
}